

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O2

void __thiscall enact::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  ~WildcardPattern(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~WildcardPattern() override = default;